

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void free_token(JSParseState *s,JSToken *token)

{
  int iVar1;
  int64_t iVar2;
  JSValueUnion JVar3;
  JSContext *ctx;
  JSValue v;
  
  iVar1 = token->val;
  if (iVar1 + 0x7fU < 2) {
    ctx = s->ctx;
    JVar3 = (JSValueUnion)(token->u).str.str.u.ptr;
    iVar2 = (token->u).str.str.tag;
LAB_0012838e:
    v.tag = iVar2;
    v.u.float64 = JVar3.float64;
    JS_FreeValue(ctx,v);
    return;
  }
  if (iVar1 != -0x7d) {
    if (iVar1 == -0x7c) {
      JS_FreeValue(s->ctx,(token->u).str.str);
      ctx = s->ctx;
      JVar3 = (JSValueUnion)(token->u).regexp.flags.u.ptr;
      iVar2 = (token->u).regexp.flags.tag;
      goto LAB_0012838e;
    }
    if ((iVar1 != -0x57) && (0x2d < iVar1 + 0x55U)) {
      return;
    }
  }
  JS_FreeAtom(s->ctx,(token->u).ident.atom);
  return;
}

Assistant:

static void free_token(JSParseState *s, JSToken *token)
{
    switch(token->val) {
#ifdef CONFIG_BIGNUM
    case TOK_NUMBER:
        JS_FreeValue(s->ctx, token->u.num.val);
        break;
#endif
    case TOK_STRING:
    case TOK_TEMPLATE:
        JS_FreeValue(s->ctx, token->u.str.str);
        break;
    case TOK_REGEXP:
        JS_FreeValue(s->ctx, token->u.regexp.body);
        JS_FreeValue(s->ctx, token->u.regexp.flags);
        break;
    case TOK_IDENT:
    case TOK_PRIVATE_NAME:
        JS_FreeAtom(s->ctx, token->u.ident.atom);
        break;
    default:
        if (token->val >= TOK_FIRST_KEYWORD &&
            token->val <= TOK_LAST_KEYWORD) {
            JS_FreeAtom(s->ctx, token->u.ident.atom);
        }
        break;
    }
}